

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall
FxIdentifier::ResolveMember
          (FxIdentifier *this,FCompileContext *ctx,PStruct *classctx,FxExpression **object,
          PStruct *objtype)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FxClassDefaults *this_00;
  undefined4 extraout_var;
  PField *mem;
  FxExpression *pFVar5;
  FxStructMember *this_01;
  undefined4 extraout_var_00;
  char *message;
  PClass *pPVar6;
  char *pcVar7;
  FScriptPosition *pFVar8;
  PSymbolTable *symtbl;
  FName local_34;
  
  bVar1 = DObject::IsKindOf((DObject *)objtype,PClass::RegistrationInfo.MyClass);
  local_34.Index = (this->Identifier).Index;
  if (local_34.Index == 0x249) {
    pPVar6 = PClassActor::RegistrationInfo.MyClass;
    bVar1 = DObject::IsKindOf((DObject *)objtype,PClassActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'Default\' requires an actor type.")
      ;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    this_00 = (FxClassDefaults *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar6);
    FxClassDefaults::FxClassDefaults(this_00,*object,&(this->super_FxExpression).ScriptPosition);
    *object = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    iVar3 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
    return (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  mem = (PField *)
        PSymbolTable::FindSymbolInTable
                  (&(objtype->super_PNamedType).super_PCompoundType.super_PType.Symbols,&local_34,
                   &symtbl);
  if (mem == (PField *)0x0) {
    pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Unknown identifier \'%s\'";
  }
  else {
    bVar2 = DObject::IsKindOf((DObject *)mem,PSymbolConst::RegistrationInfo.MyClass);
    if (bVar2) {
      pFVar8 = &(this->super_FxExpression).ScriptPosition;
      pcVar7 = "struct";
      if (bVar1) {
        pcVar7 = "class";
      }
      FScriptPosition::Message
                (pFVar8,8,"Resolving name \'%s\' as %s constant\n",
                 FName::NameData.NameArray[(this->Identifier).Index].Text,pcVar7);
      if (*object != (FxExpression *)0x0) {
        (*(*object)->_vptr_FxExpression[1])();
      }
      *object = (FxExpression *)0x0;
      pFVar5 = FxConstant::MakeConstant((PSymbol *)mem,pFVar8);
      return pFVar5;
    }
    pPVar6 = PField::RegistrationInfo.MyClass;
    bVar2 = DObject::IsKindOf((DObject *)mem,PField::RegistrationInfo.MyClass);
    if (bVar2) {
      uVar4 = mem->Flags;
      if (((char)uVar4 < '\0') && (ctx->FromDecorate == false)) {
        pPVar6 = (PClass *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,0,
                   "Accessing deprecated member variable %s",
                   FName::NameData.NameArray
                   [*(int *)&(mem->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
        uVar4 = mem->Flags;
      }
      if (((uVar4 & 0x20) != 0) &&
         (symtbl != &(classctx->super_PNamedType).super_PCompoundType.super_PType.Symbols)) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Private member %s not accessible",
                   FName::NameData.NameArray
                   [*(int *)&(mem->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
        return (FxExpression *)0x0;
      }
      this_01 = (FxStructMember *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar6);
      pFVar8 = &(this->super_FxExpression).ScriptPosition;
      if (bVar1) {
        FxClassMember::FxClassMember((FxClassMember *)this_01,*object,mem,pFVar8);
      }
      else {
        FxStructMember::FxStructMember(this_01,*object,mem,pFVar8);
      }
      *object = (FxExpression *)0x0;
      iVar3 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
      return (FxExpression *)CONCAT44(extraout_var_00,iVar3);
    }
    bVar1 = DObject::IsKindOf((DObject *)mem,PFunction::RegistrationInfo.MyClass);
    pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Invalid member identifier \'%s\'.\n";
    if (bVar1) {
      message = "Function \'%s\' used without ().\n";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar7);
  if (*object != (FxExpression *)0x0) {
    (*(*object)->_vptr_FxExpression[1])();
  }
  *object = (FxExpression *)0x0;
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxIdentifier::ResolveMember(FCompileContext &ctx, PStruct *classctx, FxExpression *&object, PStruct *objtype)
{
	PSymbol *sym;
	PSymbolTable *symtbl;
	bool isclass = objtype->IsKindOf(RUNTIME_CLASS(PClass));

	if (Identifier == NAME_Default)
	{
		if (!objtype->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(object, ScriptPosition);
		object = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if ((sym = objtype->Symbols.FindSymbolInTable(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as %s constant\n", Identifier.GetChars(), isclass ? "class" : "struct");
			delete object;
			object = nullptr;
			return FxConstant::MakeConstant(sym, ScriptPosition);
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			PField *vsym = static_cast<PField*>(sym);

			// We have 4 cases to consider here:
			// 1. The symbol is a static/meta member (not implemented yet) which is always accessible.
			// 2. This is a static function 
			// 3. This is an action function with a restricted self pointer
			// 4. This is a normal member or unrestricted action function.
			if (vsym->Flags & VARF_Deprecated && !ctx.FromDecorate)
			{
				ScriptPosition.Message(MSG_WARNING, "Accessing deprecated member variable %s", vsym->SymbolName.GetChars());
			}
			if ((vsym->Flags & VARF_Private) && symtbl != &classctx->Symbols)
			{
				ScriptPosition.Message(MSG_ERROR, "Private member %s not accessible", vsym->SymbolName.GetChars());
				return nullptr;
			}

			auto x = isclass ? new FxClassMember(object, vsym, ScriptPosition) : new FxStructMember(object, vsym, ScriptPosition);
			object = nullptr;
			return x->Resolve(ctx);
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete object;
			object = nullptr;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
		delete object;
		object = nullptr;
		return nullptr;
	}
}